

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuImageIO.cpp
# Opt level: O2

void tcu::ImageIO::savePNG(ConstPixelBufferAccess *src,char *fileName)

{
  ChannelOrder CVar1;
  ChannelType CVar2;
  int iVar3;
  int iVar4;
  FILE *__stream;
  __jmp_buf_tag *__env;
  InternalError *pIVar5;
  int y;
  ulong uVar6;
  ulong uVar7;
  pointer_____offset_0x10___ *ppuVar8;
  undefined8 uStack_60;
  allocator_type local_49;
  png_structp pngPtr;
  png_infop infoPtr;
  vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> rowPointers;
  
  __stream = fopen(fileName,"wb");
  if (__stream == (FILE *)0x0) {
    pIVar5 = (InternalError *)__cxa_allocate_exception(0x38);
    TestError::TestError
              ((TestError *)pIVar5,(char *)0x0,"fp",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/common/tcuImageIO.cpp"
               ,0x9e);
  }
  else {
    pngPtr = (png_structp)png_create_write_struct("1.6.37",0,0);
    if (pngPtr == (png_structp)0x0) {
      fclose(__stream);
      if (pngPtr == (png_structp)0x0) {
        pIVar5 = (InternalError *)__cxa_allocate_exception(0x38);
        TestError::TestError
                  ((TestError *)pIVar5,(char *)0x0,"pngPtr",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/common/tcuImageIO.cpp"
                   ,0xa5);
        goto LAB_008dbe7e;
      }
    }
    infoPtr = (png_infop)png_create_info_struct(pngPtr);
    if (infoPtr != (png_infop)0x0) {
      __env = (__jmp_buf_tag *)png_set_longjmp_fn(pngPtr,longjmp,200);
      iVar4 = _setjmp(__env);
      if (iVar4 != 0) {
        png_destroy_write_struct(&pngPtr,&infoPtr);
        fclose(__stream);
        pIVar5 = (InternalError *)__cxa_allocate_exception(0x38);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&rowPointers,"PNG compression failed",(allocator<char> *)&local_49);
        InternalError::InternalError(pIVar5,(string *)&rowPointers);
        __cxa_throw(pIVar5,&InternalError::typeinfo,Exception::~Exception);
      }
      CVar1 = (src->m_format).order;
      CVar2 = (src->m_format).type;
      if (CVar2 == UNORM_INT8 && CVar1 == RGB) {
        uStack_60 = 2;
LAB_008dbc84:
        png_init_io(pngPtr,__stream);
        png_set_IHDR(pngPtr,infoPtr,(src->m_size).m_data[0],(src->m_size).m_data[1],8,uStack_60,0,0,
                     0);
        png_write_info(pngPtr,infoPtr);
        std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>::vector
                  (&rowPointers,(long)(src->m_size).m_data[1],&local_49);
        iVar4 = (src->m_size).m_data[1];
        iVar3 = (src->m_pitch).m_data[1];
        uVar6 = 0;
        uVar7 = uVar6;
        for (; (long)uVar6 < (long)iVar4; uVar6 = uVar6 + 1) {
          rowPointers.super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>._M_impl.
          super__Vector_impl_data._M_start[uVar6] = (uchar *)((long)src->m_data + (long)(int)uVar7);
          uVar7 = (ulong)(uint)((int)uVar7 + iVar3);
        }
        png_write_image(pngPtr,rowPointers.
                               super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>
                               ._M_impl.super__Vector_impl_data._M_start);
        png_write_end(pngPtr,0);
        png_destroy_write_struct(&pngPtr,&infoPtr);
        fclose(__stream);
        std::_Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>::~_Vector_base
                  (&rowPointers.
                    super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>);
        return;
      }
      if ((CVar1 == RGBA) && (CVar2 == UNORM_INT8)) {
        uStack_60 = 6;
        goto LAB_008dbc84;
      }
      pIVar5 = (InternalError *)__cxa_allocate_exception(0x38);
      InternalError::InternalError
                (pIVar5,"Unsupported texture format",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/common/tcuImageIO.cpp"
                 ,0x8e);
      ppuVar8 = &InternalError::typeinfo;
      goto LAB_008dbe85;
    }
    png_destroy_write_struct(&pngPtr,0);
    pIVar5 = (InternalError *)__cxa_allocate_exception(0x38);
    TestError::TestError
              ((TestError *)pIVar5,(char *)0x0,"infoPtr",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/common/tcuImageIO.cpp"
               ,0xac);
  }
LAB_008dbe7e:
  ppuVar8 = &TestError::typeinfo;
LAB_008dbe85:
  __cxa_throw(pIVar5,ppuVar8,Exception::~Exception);
}

Assistant:

void savePNG (const ConstPixelBufferAccess& src, const char* fileName)
{
	FILE*	fp			= fopen(fileName, "wb");
	TCU_CHECK(fp);

	png_structp pngPtr = png_create_write_struct(PNG_LIBPNG_VER_STRING, NULL, NULL, NULL);

	if (!pngPtr)
	{
		fclose(fp);
		TCU_CHECK(pngPtr);
	}

	png_infop infoPtr = png_create_info_struct(pngPtr);
	if (!infoPtr)
	{
		png_destroy_write_struct(&pngPtr, NULL);
		TCU_CHECK(infoPtr);
	}

	if (setjmp(png_jmpbuf(pngPtr)))
	{
		png_destroy_write_struct(&pngPtr, &infoPtr);
		fclose(fp);
		throw tcu::InternalError("PNG compression failed");
	}
	else
	{
		int pngFormat = textureFormatToPNGFormat(src.getFormat());

		png_init_io(pngPtr, fp);

		// Header
		png_set_IHDR(pngPtr, infoPtr, src.getWidth(), src.getHeight(), 8,
					 pngFormat, PNG_INTERLACE_NONE,
					 PNG_COMPRESSION_TYPE_DEFAULT, PNG_FILTER_TYPE_DEFAULT);
		png_write_info(pngPtr, infoPtr);

		std::vector<png_bytep> rowPointers(src.getHeight());
		for (int y = 0; y < src.getHeight(); y++)
			rowPointers[y] = (deUint8*)src.getDataPtr() + y*src.getRowPitch();

		png_write_image(pngPtr, &rowPointers[0]);
		png_write_end(pngPtr, NULL);

		png_destroy_write_struct(&pngPtr, &infoPtr);
		fclose(fp);
	}
}